

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

int PatchPointer(int ptrNum)

{
  PFunction *sym;
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  FState *state_00;
  PFunction **ppPVar6;
  PClassActor *pPVar7;
  int index;
  FState *state;
  char *pcStack_18;
  int indexnum;
  char *key;
  int result;
  int ptrNum_local;
  
  pcVar4 = strchr(Line2,0x28);
  if (pcVar4 == (char *)0x0) {
    pcStack_18 = (char *)0x0;
  }
  else {
    pcStack_18 = strchr(pcVar4 + 1,0x20);
  }
  key._4_4_ = ptrNum;
  if ((ptrNum == 0) && (pcStack_18 != (char *)0x0)) {
    pcVar4 = strchr(pcStack_18 + 1,0x29);
    *pcVar4 = '\0';
    iVar1 = atoi(pcStack_18 + 1);
    key._4_4_ = 0;
    while ((uVar2 = TArray<int,_int>::Size(&CodePConv), key._4_4_ < uVar2 &&
           (piVar5 = TArray<int,_int>::operator[](&CodePConv,(long)(int)key._4_4_), *piVar5 != iVar1
           ))) {
      key._4_4_ = key._4_4_ + 1;
    }
    DPrintf(4,"Final ptrNum: %i\n",(ulong)key._4_4_);
  }
  if (((int)key._4_4_ < 0) || (uVar2 = TArray<int,_int>::Size(&CodePConv), uVar2 <= key._4_4_)) {
    Printf("Pointer %d out of range.\n",(ulong)key._4_4_);
    key._4_4_ = 0xffffffff;
  }
  else {
    DPrintf(4,"Pointer %d\n",(ulong)key._4_4_);
  }
  while (iVar1 = GetLine(), iVar1 == 1) {
    uVar2 = TArray<int,_int>::Size(&CodePConv);
    if ((key._4_4_ < uVar2) && (iVar1 = strcasecmp(Line1,"Codep Frame"), iVar1 == 0)) {
      piVar5 = TArray<int,_int>::operator[](&CodePConv,(long)(int)key._4_4_);
      state_00 = FindState(*piVar5);
      if (state_00 == (FState *)0x0) {
        Printf("Bad code pointer %d\n",(ulong)key._4_4_);
      }
      else {
        uVar2 = atoi(Line2);
        uVar3 = TArray<PFunction_*,_PFunction_*>::Size(&Actions);
        if (uVar2 < uVar3) {
          ppPVar6 = TArray<PFunction_*,_PFunction_*>::operator[](&Actions,(long)(int)uVar2);
          sym = *ppPVar6;
          piVar5 = TArray<int,_int>::operator[](&CodePConv,(long)(int)key._4_4_);
          SetPointer(state_00,sym,*piVar5);
        }
        else {
          SetPointer(state_00,(PFunction *)0x0,0);
        }
        pPVar7 = FState::StaticFindStateOwner(state_00);
        pcVar4 = FName::GetChars(&(pPVar7->super_PClass).super_PStruct.super_PNamedType.TypeName);
        DPrintf(4,"%s has a hacked state for pointer num %i with index %i\nLine1=%s, Line2=%s\n",
                pcVar4,(ulong)key._4_4_,(ulong)uVar2,Line1,Line2);
      }
    }
    else {
      Printf(unknown_str,Line1,"Pointer",(ulong)key._4_4_);
    }
  }
  return iVar1;
}

Assistant:

static int PatchPointer (int ptrNum)
{
	int result;

	// Hack for some Boom dehacked patches that are of the form Pointer 0 (x statenumber)
	char * key;
	int indexnum;
	key=strchr(Line2, '(');
	if (key++) key=strchr(key, ' '); else key=NULL;
	if ((ptrNum == 0) && key++)
	{
		*strchr(key, ')') = '\0';
		indexnum = atoi(key);
		for (ptrNum = 0; (unsigned int) ptrNum < CodePConv.Size(); ++ptrNum)
		{
			if (CodePConv[ptrNum] == indexnum) break;
		}
		DPrintf(DMSG_SPAMMY, "Final ptrNum: %i\n", ptrNum);
	}
	// End of hack.

	// 448 Doom states with codepointers + 74 extra MBF states with codepointers = 522 total
	// Better to just use the size of the array rather than a hardcoded value.
	if (ptrNum >= 0 && (unsigned int) ptrNum < CodePConv.Size())
	{
		DPrintf (DMSG_SPAMMY, "Pointer %d\n", ptrNum);
	}
	else
	{
		Printf ("Pointer %d out of range.\n", ptrNum);
		ptrNum = -1;
	}

	while ((result = GetLine ()) == 1)
	{
		if ((unsigned)ptrNum < CodePConv.Size() && (!stricmp (Line1, "Codep Frame")))
		{
			FState *state = FindState (CodePConv[ptrNum]);
			if (state)
			{
				int index = atoi(Line2);
				if ((unsigned)(index) >= Actions.Size())
				{
					SetPointer(state, NULL);
				}
				else
				{
					SetPointer(state, Actions[index], CodePConv[ptrNum]);
				}
				DPrintf(DMSG_SPAMMY, "%s has a hacked state for pointer num %i with index %i\nLine1=%s, Line2=%s\n", 
					state->StaticFindStateOwner(state)->TypeName.GetChars(), ptrNum, index, Line1, Line2);
			}
			else
			{
				Printf ("Bad code pointer %d\n", ptrNum);
			}
		}
		else Printf (unknown_str, Line1, "Pointer", ptrNum);
	}
	return result;
}